

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printSystemPStateField(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  int64_t iVar3;
  char *s;
  char *Name;
  _Bool Valid;
  SStream *pSStack_20;
  uint Val;
  SStream *O_local;
  MCInst *pMStack_10;
  uint OpNo_local;
  MCInst *MI_local;
  
  pSStack_20 = O;
  O_local._4_4_ = OpNo;
  pMStack_10 = MI;
  op = MCInst_getOperand(MI,OpNo);
  iVar3 = MCOperand_getImm(op);
  Name._4_4_ = (uint32_t)iVar3;
  s = A64NamedImmMapper_toString(&A64PState_PStateMapper,Name._4_4_,(_Bool *)((long)&Name + 3));
  if ((Name._3_1_ & 1) == 0) {
    printInt32Bang(pSStack_20,Name._4_4_);
    puVar1 = pMStack_10->flat_insn->detail->groups +
             (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(ulong *)(pMStack_10->flat_insn->detail->groups +
              (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
         (ulong)Name._4_4_;
    pcVar2 = pMStack_10->flat_insn->detail;
    (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
  }
  else {
    SStream_concat0(pSStack_20,s);
    if (pMStack_10->csh->detail != CS_OPT_OFF) {
      puVar1 = pMStack_10->flat_insn->detail->groups +
               (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = 'C';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint32_t *)
       (pMStack_10->flat_insn->detail->groups +
       (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = Name._4_4_;
      pcVar2 = pMStack_10->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
  }
  return;
}

Assistant:

static void printSystemPStateField(MCInst *MI, unsigned OpNo, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
	bool Valid;
	char *Name;

	Name = A64NamedImmMapper_toString(&A64PState_PStateMapper, Val, &Valid);
	if (Valid) {
		SStream_concat0(O, Name);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_PSTATE;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].pstate = Val;
			MI->flat_insn->detail->arm64.op_count++;
		}
	} else {
		printInt32Bang(O, Val);
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Val;
		MI->flat_insn->detail->arm64.op_count++;
	}
}